

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

void __thiscall
wabt::intrusive_list<wabt::ModuleField>::clear(intrusive_list<wabt::ModuleField> *this)

{
  _func_int ***ppp_Var1;
  ModuleField *pMVar2;
  
  pMVar2 = this->first_;
  while (pMVar2 != (ModuleField *)0x0) {
    ppp_Var1 = &pMVar2->_vptr_ModuleField;
    pMVar2 = (pMVar2->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*(*ppp_Var1)[1])();
  }
  this->first_ = (ModuleField *)0x0;
  this->last_ = (ModuleField *)0x0;
  this->size_ = 0;
  return;
}

Assistant:

inline void intrusive_list<T>::clear() noexcept {
  for (T* iter = first_; iter;) {
    T* next = iter->next_;
    delete iter;
    iter = next;
  }
  first_ = last_ = nullptr;
  size_ = 0;
}